

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void QConcatenable<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>_>::
     appendTo<QChar>(type *p,QChar **out)

{
  type *in_RSI;
  QChar **in_stack_ffffffffffffffe8;
  
  QConcatenable<QStringBuilder<ProString,_ProString>_>::appendTo<QChar>
            (in_RSI,in_stack_ffffffffffffffe8);
  QConcatenable<ProString>::appendTo((ProString *)p,out);
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }